

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

void Sbl_ManStop(Sbl_Man_t *p)

{
  int *piVar1;
  Hsh_VecMan_t *__ptr;
  Vec_Wec_t *__ptr_00;
  void *__ptr_01;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  
  sat_solver_delete(p->pSat);
  pVVar5 = p->vCardVars;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vLeaves;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vAnds;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vNodes;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vRoots;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vRootVars;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  __ptr = p->pHash;
  pVVar5 = __ptr->vTable;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = __ptr->vData;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = __ptr->vMap;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  free(__ptr);
  pVVar5 = p->vArrs;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vReqs;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  __ptr_00 = p->vWindow;
  iVar4 = __ptr_00->nCap;
  pVVar5 = __ptr_00->pArray;
  if (iVar4 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00752e57;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      __ptr_01 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (__ptr_01 != (void *)0x0) {
        free(__ptr_01);
        pVVar5 = __ptr_00->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = __ptr_00->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
  }
  free(pVVar5);
LAB_00752e57:
  free(__ptr_00);
  pVVar5 = p->vPath;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vEdges;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar2 = p->vCutsI1;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar2 = p->vCutsI2;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar2 = p->vCutsN1;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar2 = p->vCutsN2;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar5 = p->vCutsNum;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vCutsStart;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vCutsObj;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vSolInit;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vSolCur;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vSolBest;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar2 = p->vTempI1;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempI2;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempN1;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar2 = p->vTempN2;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar5 = p->vLits;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vAssump;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vPolar;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  free(p);
  return;
}

Assistant:

void Sbl_ManStop( Sbl_Man_t * p )
{
    sat_solver_delete( p->pSat );
    Vec_IntFree( p->vCardVars );
    // internal
    Vec_IntFree( p->vLeaves );
    Vec_IntFree( p->vAnds );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vRootVars );
    Hsh_VecManStop( p->pHash );
    // timing
    Vec_IntFree( p->vArrs );
    Vec_IntFree( p->vReqs );
    Vec_WecFree( p->vWindow );
    Vec_IntFree( p->vPath );
    Vec_IntFree( p->vEdges );
    // cuts
    Vec_WrdFree( p->vCutsI1 );
    Vec_WrdFree( p->vCutsI2 );
    Vec_WrdFree( p->vCutsN1 );
    Vec_WrdFree( p->vCutsN2 );
    Vec_IntFree( p->vCutsNum );
    Vec_IntFree( p->vCutsStart );
    Vec_IntFree( p->vCutsObj );
    Vec_IntFree( p->vSolInit );
    Vec_IntFree( p->vSolCur );
    Vec_IntFree( p->vSolBest );
    Vec_WrdFree( p->vTempI1 );
    Vec_WrdFree( p->vTempI2 );
    Vec_WrdFree( p->vTempN1 );
    Vec_WrdFree( p->vTempN2 );
    // temporary
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vAssump );
    Vec_IntFree( p->vPolar );
    // other
    ABC_FREE( p );
}